

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O1

void value_move(value src,value dst)

{
  undefined8 uVar1;
  
  if (dst != (value)0x0 && src != (value)0x0) {
    uVar1 = *(undefined8 *)((long)src + -8);
    *(undefined8 *)((long)dst + -0x10) = *(undefined8 *)((long)src + -0x10);
    *(undefined8 *)((long)dst + -8) = uVar1;
    *(undefined8 *)((long)src + -0x10) = 0;
    *(undefined8 *)((long)src + -8) = 0;
  }
  return;
}

Assistant:

void value_move(value src, value dst)
{
	if (src != NULL && dst != NULL)
	{
		value_impl impl_src = value_descriptor(src);
		value_impl impl_dst = value_descriptor(dst);

		impl_dst->finalizer = impl_src->finalizer;
		impl_dst->finalizer_data = impl_src->finalizer_data;

		impl_src->finalizer = NULL;
		impl_src->finalizer_data = NULL;
	}
}